

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O1

bool __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::FindOrAdd
          (WeakReferenceHashTable<PrimePolicy> *this,char *strongReference,Recycler *recycler,
          RecyclerWeakReferenceBase **ppWeakRef)

{
  code *pcVar1;
  bool bVar2;
  hash_t targetBucket;
  undefined4 *puVar3;
  RecyclerWeakReferenceBase *pRVar4;
  RecyclerWeakReferenceBase *pRVar5;
  
  if (ppWeakRef == (RecyclerWeakReferenceBase **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x95,"(ppWeakRef)","ppWeakRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  targetBucket = PrimePolicy::ModPrime
                           ((hash_t)((ulong)strongReference >> 4),this->size,this->modFunctionIndex)
  ;
  for (pRVar5 = this->buckets[targetBucket];
      (pRVar5 != (RecyclerWeakReferenceBase *)0x0 && (pRVar5->strongRef != strongReference));
      pRVar5 = pRVar5->next) {
  }
  pRVar4 = pRVar5;
  if (pRVar5 == (RecyclerWeakReferenceBase *)0x0) {
    pRVar4 = Create(this,strongReference,targetBucket,recycler);
  }
  *ppWeakRef = pRVar4;
  return pRVar5 == (RecyclerWeakReferenceBase *)0x0;
}

Assistant:

bool FindOrAdd(char* strongReference, Recycler *recycler, RecyclerWeakReferenceBase **ppWeakRef)
    {
        Assert(ppWeakRef);

        uint targetBucket = HashKeyToBucket(strongReference, size);
        RecyclerWeakReferenceBase* entry = FindEntry(strongReference, targetBucket);
        if (entry != nullptr)
        {
            *ppWeakRef = entry;
            return false;
        }

        entry = Create(strongReference, targetBucket, recycler);
        *ppWeakRef = entry;
        return true;
    }